

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Vec_Int_t *
Gia_Gen2CreateMuxes(Gia_Man_t *pNew,int nLutSize,int nLutNum,Vec_Int_t *vPLits,Vec_Int_t *vXLits)

{
  int Entry;
  Vec_Int_t *p;
  int iVar1;
  
  p = Vec_IntAlloc(nLutNum);
  if (vPLits->nSize != nLutNum << ((byte)nLutSize & 0x1f)) {
    __assert_fail("Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0xd6,
                  "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  if (vXLits->nSize == nLutSize) {
    iVar1 = 0;
    if (nLutNum < 1) {
      nLutNum = 0;
      iVar1 = 0;
    }
    for (; nLutNum != iVar1; iVar1 = iVar1 + 1) {
      Entry = Gia_Gen2CreateMux_rec
                        (pNew,vXLits->pArray,nLutSize,vPLits,iVar1 << ((byte)nLutSize & 0x1f));
      Vec_IntPush(p,Entry);
    }
    return p;
  }
  __assert_fail("Vec_IntSize(vXLits) == nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                ,0xd7,
                "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_Gen2CreateMuxes( Gia_Man_t * pNew, int nLutSize, int nLutNum, Vec_Int_t * vPLits, Vec_Int_t * vXLits )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, iMux;
    // add MUXes for each group of flops
    assert( Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize) );
    assert( Vec_IntSize(vXLits) == nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        iMux = Gia_Gen2CreateMux_rec( pNew, Vec_IntArray(vXLits), nLutSize, vPLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}